

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decaf.c
# Opt level: O2

void decaf_448_point_mul_by_ratio_and_encode_like_x448(uint8_t *out,decaf_448_point_s *p)

{
  gf_448_s *bs;
  decaf_448_point_t q;
  decaf_448_point_s dStack_160;
  
  memcpy(&dStack_160,p,0x100);
  gf_invert(dStack_160.t,dStack_160.x,0);
  bs = dStack_160.y;
  gf_448_mul(dStack_160.z,dStack_160.t,bs);
  gf_448_sqr(bs,dStack_160.z);
  gf_448_serialize(out,bs);
  decaf_448_point_destroy(&dStack_160);
  return;
}

Assistant:

void API_NS(point_mul_by_ratio_and_encode_like_x448) (
    uint8_t out[X_PUBLIC_BYTES],
    const point_t p
) {
    point_t q;
#if COFACTOR == 8
    point_double_internal(q,p,1);
#else
    API_NS(point_copy)(q,p);
#endif
    gf_invert(q->t,q->x,0); /* 1/x */
    gf_mul(q->z,q->t,q->y); /* y/x */
    gf_sqr(q->y,q->z); /* (y/x)^2 */
#if IMAGINE_TWIST
    gf_sub(q->y,ZERO,q->y);
#endif
    gf_serialize(out,q->y);
    API_NS(point_destroy(q));
}